

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::invalidateSubFramebuffer
          (GLContext *this,deUint32 target,int numAttachments,deUint32 *attachments,int x,int y,
          int width,int height)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  MessageBuilder *pMVar7;
  undefined4 extraout_var;
  int *piVar8;
  Enum<int,_2UL> EVar9;
  EnumPointerFmt local_1f8;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  undefined1 local_30 [8];
  IVec2 drawOffset;
  int y_local;
  int x_local;
  deUint32 *attachments_local;
  int numAttachments_local;
  deUint32 target_local;
  GLContext *this_local;
  
  drawOffset.m_data[0] = y;
  drawOffset.m_data[1] = x;
  attachments_local._0_4_ = numAttachments;
  attachments_local._4_4_ = target;
  _numAttachments_local = this;
  getDrawOffset((GLContext *)local_30);
  if ((this->m_logFlags & 1) != 0) {
    tcu::TestLog::operator<<(&local_1b0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [28])"glInvalidateSubFramebuffer(");
    EVar9 = glu::getFramebufferTargetStr(attachments_local._4_4_);
    local_1e0 = EVar9.m_getName;
    local_1d8 = EVar9.m_value;
    local_1d0[0].m_getName = local_1e0;
    local_1d0[0].m_value = local_1d8;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_1d0);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0xf95514);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&attachments_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0xf95514);
    glu::getInvalidateAttachmentStr(&local_1f8,attachments,(int)attachments_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1f8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0xf95514);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,drawOffset.m_data + 1);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0xf95514);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,drawOffset.m_data);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0xf95514);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&width);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0xf95514);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&height);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xf2e642);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  iVar6 = (*this->m_context->_vptr_RenderContext[3])();
  dVar5 = attachments_local._4_4_;
  iVar4 = (int)attachments_local;
  iVar3 = drawOffset.m_data[1];
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar6) + 0xc50);
  piVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_30);
  iVar2 = drawOffset.m_data[0];
  iVar6 = *piVar8;
  piVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_30);
  (*pcVar1)(dVar5,iVar4,attachments,iVar3 + iVar6,iVar2 + *piVar8,width,height);
  return;
}

Assistant:

void GLContext::invalidateSubFramebuffer (deUint32 target, int numAttachments, const deUint32* attachments, int x, int y, int width, int height)
{
	tcu::IVec2 drawOffset = getDrawOffset();

	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glInvalidateSubFramebuffer("
								  << glu::getFramebufferTargetStr(target) << ", " << numAttachments << ", "
								  << glu::getInvalidateAttachmentStr(attachments, numAttachments) << ", "
								  << x << ", " << y << ", " << width << ", " << height << ")"
			  << TestLog::EndMessage;

	m_context.getFunctions().invalidateSubFramebuffer(target, numAttachments, attachments, x+drawOffset.x(), y+drawOffset.y(), width, height);
}